

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O1

void Cmd_nextmap(FCommandLine *argv,APlayerPawn *who,int key)

{
  FString mapname;
  int iVar1;
  char *format;
  
  mapname.Chars = level.NextMap.Chars;
  if (netgame) {
    format = "Use \x1c+changemap\x1c- instead. \x1c+Nextmap\x1c- is for single-player only.\n";
  }
  else {
    if (*(int *)(level.NextMap.Chars + -0xc) != 0) {
      iVar1 = strncmp(level.NextMap.Chars,"enDSeQ",6);
      if (iVar1 != 0) {
        G_DeferedInitNew(mapname.Chars,-1);
        return;
      }
    }
    format = "no next map!\n";
  }
  Printf(format);
  return;
}

Assistant:

CCMD(nextmap)
{
	if (netgame)
	{
		Printf ("Use " TEXTCOLOR_BOLD "changemap" TEXTCOLOR_NORMAL " instead. " TEXTCOLOR_BOLD "Nextmap"
				TEXTCOLOR_NORMAL " is for single-player only.\n");
		return;
	}
	
	if (level.NextMap.Len() > 0 && level.NextMap.Compare("enDSeQ", 6))
	{
		G_DeferedInitNew(level.NextMap);
	}
	else
	{
		Printf("no next map!\n");
	}
}